

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

oonf_layer2_destination *
oonf_layer2_destination_add
          (oonf_layer2_neigh *l2neigh,netaddr *destination,oonf_layer2_origin *origin)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint8_t uVar4;
  long lVar5;
  oonf_layer2_destination *ptr;
  
  lVar5 = avl_find(&l2neigh->destinations);
  if (lVar5 == 0) {
    ptr = (oonf_layer2_destination *)oonf_class_malloc(&_l2dst_class);
    if (ptr == (oonf_layer2_destination *)0x0) {
      ptr = (oonf_layer2_destination *)0x0;
    }
    else {
      uVar4 = destination->_prefix_len;
      (ptr->destination)._type = destination->_type;
      (ptr->destination)._prefix_len = uVar4;
      uVar1 = *(undefined4 *)(destination->_addr + 4);
      uVar2 = *(undefined4 *)(destination->_addr + 8);
      uVar3 = *(undefined4 *)(destination->_addr + 0xc);
      *(undefined4 *)(ptr->destination)._addr = *(undefined4 *)destination->_addr;
      *(undefined4 *)((ptr->destination)._addr + 4) = uVar1;
      *(undefined4 *)((ptr->destination)._addr + 8) = uVar2;
      *(undefined4 *)((ptr->destination)._addr + 0xc) = uVar3;
      ptr->origin = origin;
      ptr->neighbor = l2neigh;
      (ptr->_node).key = ptr;
      avl_insert(&l2neigh->destinations,&ptr->_node);
      oonf_class_event(&_l2dst_class,ptr,OONF_OBJECT_ADDED);
    }
  }
  else {
    ptr = (oonf_layer2_destination *)(lVar5 + -0x28);
  }
  return ptr;
}

Assistant:

struct oonf_layer2_destination *
oonf_layer2_destination_add(
  struct oonf_layer2_neigh *l2neigh, const struct netaddr *destination, const struct oonf_layer2_origin *origin) {
  struct oonf_layer2_destination *l2dst;

  l2dst = oonf_layer2_destination_get(l2neigh, destination);
  if (l2dst) {
    return l2dst;
  }

  l2dst = oonf_class_malloc(&_l2dst_class);
  if (!l2dst) {
    return NULL;
  }

  /* copy data into destination storage */
  memcpy(&l2dst->destination, destination, sizeof(*destination));
  l2dst->origin = origin;

  /* add back-pointer */
  l2dst->neighbor = l2neigh;

  /* add to neighbor tree */
  l2dst->_node.key = &l2dst->destination;
  avl_insert(&l2neigh->destinations, &l2dst->_node);

  oonf_class_event(&_l2dst_class, l2dst, OONF_OBJECT_ADDED);
  return l2dst;
}